

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall
google::protobuf::FieldDescriptor::CopyTo(FieldDescriptor *this,FieldDescriptorProto *proto)

{
  byte *pbVar1;
  int32 iVar2;
  long lVar3;
  long lVar4;
  FieldDescriptorProto_Type value;
  CppType CVar5;
  string *psVar6;
  Descriptor *pDVar7;
  EnumDescriptor *pEVar8;
  FieldOptions *pFVar9;
  FieldOptions *pFVar10;
  string sStack_38;
  
  FieldDescriptorProto::set_name(proto,*(string **)this);
  iVar2 = *(int32 *)(this + 0x38);
  (proto->_has_bits_).has_bits_[0] = (proto->_has_bits_).has_bits_[0] | 0x40;
  proto->number_ = iVar2;
  if (this[0x20] == (FieldDescriptor)0x1) {
    FieldDescriptorProto::set_json_name(proto,*(string **)(this + 0x28));
  }
  FieldDescriptorProto::set_label(proto,*(FieldDescriptorProto_Label *)(this + 0x4c));
  value = type(this);
  FieldDescriptorProto::set_type(proto,value);
  if (this[0x50] == (FieldDescriptor)0x1) {
    if (*(char *)(*(long *)(this + 0x58) + 0x29) == '\0') {
      FieldDescriptorProto::set_extendee(proto,".");
    }
    psVar6 = FieldDescriptorProto::mutable_extendee_abi_cxx11_(proto);
    std::__cxx11::string::append((string *)psVar6);
  }
  CVar5 = cpp_type(this);
  if (CVar5 == CPPTYPE_MESSAGE) {
    pDVar7 = message_type(this);
    if (pDVar7[0x28] == (Descriptor)0x1) {
      proto->type_ = 1;
      pbVar1 = (byte *)((long)(proto->_has_bits_).has_bits_ + 1);
      *pbVar1 = *pbVar1 & 0xfd;
    }
    pDVar7 = message_type(this);
    if (pDVar7[0x29] == (Descriptor)0x0) {
      FieldDescriptorProto::set_type_name(proto,".");
    }
    psVar6 = FieldDescriptorProto::mutable_type_name_abi_cxx11_(proto);
    message_type(this);
  }
  else {
    CVar5 = cpp_type(this);
    if (CVar5 != CPPTYPE_ENUM) goto LAB_002de53e;
    pEVar8 = enum_type(this);
    if (pEVar8[0x29] == (EnumDescriptor)0x0) {
      FieldDescriptorProto::set_type_name(proto,".");
    }
    psVar6 = FieldDescriptorProto::mutable_type_name_abi_cxx11_(proto);
    enum_type(this);
  }
  std::__cxx11::string::append((string *)psVar6);
LAB_002de53e:
  if (this[0x98] == (FieldDescriptor)0x1) {
    DefaultValueAsString_abi_cxx11_(&sStack_38,this,false);
    FieldDescriptorProto::set_default_value(proto,&sStack_38);
    std::__cxx11::string::~string((string *)&sStack_38);
  }
  lVar3 = *(long *)(this + 0x60);
  if ((lVar3 != 0) && (this[0x50] == (FieldDescriptor)0x0)) {
    lVar4 = *(long *)(*(long *)(lVar3 + 0x10) + 0x40);
    (proto->_has_bits_).has_bits_[0] = (proto->_has_bits_).has_bits_[0] | 0x80;
    proto->oneof_index_ = (int32)((lVar3 - lVar4) / 0x30);
  }
  pFVar10 = *(FieldOptions **)(this + 0x80);
  pFVar9 = FieldOptions::default_instance();
  if (pFVar10 != pFVar9) {
    pFVar10 = FieldDescriptorProto::mutable_options(proto);
    FieldOptions::CopyFrom(pFVar10,*(FieldOptions **)(this + 0x80));
  }
  return;
}

Assistant:

void FieldDescriptor::CopyTo(FieldDescriptorProto* proto) const {
  proto->set_name(name());
  proto->set_number(number());
  if (has_json_name_) {
    proto->set_json_name(json_name());
  }

  // Some compilers do not allow static_cast directly between two enum types,
  // so we must cast to int first.
  proto->set_label(static_cast<FieldDescriptorProto::Label>(
                     implicit_cast<int>(label())));
  proto->set_type(static_cast<FieldDescriptorProto::Type>(
                    implicit_cast<int>(type())));

  if (is_extension()) {
    if (!containing_type()->is_unqualified_placeholder_) {
      proto->set_extendee(".");
    }
    proto->mutable_extendee()->append(containing_type()->full_name());
  }

  if (cpp_type() == CPPTYPE_MESSAGE) {
    if (message_type()->is_placeholder_) {
      // We don't actually know if the type is a message type.  It could be
      // an enum.
      proto->clear_type();
    }

    if (!message_type()->is_unqualified_placeholder_) {
      proto->set_type_name(".");
    }
    proto->mutable_type_name()->append(message_type()->full_name());
  } else if (cpp_type() == CPPTYPE_ENUM) {
    if (!enum_type()->is_unqualified_placeholder_) {
      proto->set_type_name(".");
    }
    proto->mutable_type_name()->append(enum_type()->full_name());
  }

  if (has_default_value()) {
    proto->set_default_value(DefaultValueAsString(false));
  }

  if (containing_oneof() != NULL && !is_extension()) {
    proto->set_oneof_index(containing_oneof()->index());
  }

  if (&options() != &FieldOptions::default_instance()) {
    proto->mutable_options()->CopyFrom(options());
  }
}